

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

char * SQCompilation::symbolContextName(SymbolKind k)

{
  SymbolKind k_local;
  char *local_8;
  
  switch(k) {
  case SK_EXCEPTION:
    local_8 = "exception";
    break;
  case SK_FUNCTION:
    local_8 = "function";
    break;
  case SK_CLASS:
    local_8 = "class";
    break;
  case SK_TABLE:
    local_8 = "table";
    break;
  case SK_VAR:
    local_8 = "variable";
    break;
  case SK_BINDING:
    local_8 = "let";
    break;
  case SK_CONST:
    local_8 = "const";
    break;
  case SK_ENUM:
    local_8 = "enum";
    break;
  case SK_ENUM_CONST:
    local_8 = "enum const";
    break;
  case SK_PARAM:
    local_8 = "parameter";
    break;
  case SK_FOREACH:
    local_8 = "foreach var";
    break;
  case SK_EXTERNAL_BINDING:
    local_8 = "external binding";
    break;
  default:
    local_8 = "<unknown>";
  }
  return local_8;
}

Assistant:

static const char *symbolContextName(enum SymbolKind k) {
  switch (k)
  {
  case SK_EXCEPTION: return "exception";
  case SK_FUNCTION: return "function";
  case SK_CLASS: return "class";
  case SK_TABLE: return "table";
  case SK_VAR: return "variable";
  case SK_BINDING: return "let";
  case SK_CONST: return "const";
  case SK_ENUM: return "enum";
  case SK_ENUM_CONST: return "enum const";
  case SK_PARAM: return "parameter";
  case SK_FOREACH: return "foreach var";
  case SK_EXTERNAL_BINDING: return "external binding";
  default: return "<unknown>";
  }
}